

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address-conversion.cc
# Opt level: O0

uint64_t str2num(string *str)

{
  int iVar1;
  string *__str;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  string *in_RDI;
  uint64_t result;
  size_t pos;
  size_t *in_stack_ffffffffffffff78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  allocator<char> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  string local_38 [32];
  _Alloc_hider *local_18;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_10 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
  local_18 = (_Alloc_hider *)0x0;
  while( true ) {
    __str = (string *)((long)local_18 << 8);
    iVar1 = std::__cxx11::stoi(__str,in_stack_ffffffffffffff78,0);
    local_18 = &__str->_M_dataplus + iVar1;
    this = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&local_10->_M_current + 1);
    local_10 = this;
    p_Var2 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::__cxx11::string::size();
    if (this == p_Var2) break;
    std::__cxx11::string::begin();
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator+(this,(difference_type)__str);
    __beg._M_current = (char *)std::__cxx11::string::end();
    in_stack_ffffffffffffff78 = (size_t *)&stack0xffffffffffffffaf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (in_stack_ffffffffffffffa0,__beg,in_stack_ffffffffffffffa8,in_stack_ffffffffffffff98);
    std::__cxx11::string::operator=(in_RDI,local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  }
  return (uint64_t)local_18;
}

Assistant:

uint64_t str2num(std::string str)
{
    size_t   pos    = 0;
    uint64_t result = 0;

    while (1)
    {
        result = result * 0x100 + std::stoi(str, &pos, 16);
        if (++pos == str.size())
        {
            break;
        }
        str = std::string(str.begin() + pos, str.end());
    }
    return result;
}